

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::utf8_3bytes(spec *param_1)

{
  sequence *in_RDI;
  undefined8 in_stack_fffffffffffffe58;
  undefined2 uVar1;
  character_in_range *in_stack_fffffffffffffe60;
  either *this;
  character_in_range *in_stack_fffffffffffffe70;
  sequence *args_3;
  character_in_range *in_stack_fffffffffffffe78;
  sequence *args_2;
  sequence *in_stack_fffffffffffffe80;
  sequence *this_00;
  sequence *args;
  sequence *this_01;
  undefined1 local_150 [32];
  either local_130;
  undefined1 local_100 [64];
  undefined1 local_c0 [192];
  
  uVar1 = (undefined2)((ulong)in_stack_fffffffffffffe58 >> 0x30);
  this_01 = in_RDI;
  character::character
            ((character *)in_stack_fffffffffffffe60,
             (char_type)((ulong)in_stack_fffffffffffffe58 >> 0x38));
  character_in_range::character_in_range
            (in_stack_fffffffffffffe60,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (in_stack_fffffffffffffe80,(character *)in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70);
  this_00 = (sequence *)(local_c0 + 0x10);
  character_in_range::character_in_range
            (in_stack_fffffffffffffe60,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  args = (sequence *)local_c0;
  character_in_range::character_in_range
            (in_stack_fffffffffffffe60,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::sequence<toml::detail::character_in_range,toml::detail::character_in_range>
            (this_00,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  args_3 = (sequence *)(local_100 + 0x10);
  character::character((character *)in_stack_fffffffffffffe60,(char_type)((ushort)uVar1 >> 8));
  args_2 = (sequence *)local_100;
  character_in_range::character_in_range
            (in_stack_fffffffffffffe60,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (this_00,(character *)args_2,(character_in_range *)args_3);
  this = &local_130;
  character_in_range::character_in_range
            ((character_in_range *)this,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  character_in_range::character_in_range
            ((character_in_range *)this,(char_type)((ushort)uVar1 >> 8),(char_type)uVar1);
  sequence::sequence<toml::detail::character_in_range,toml::detail::character_in_range>
            (this_00,(character_in_range *)args_2,(character_in_range *)args_3);
  either::
  either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            ((either *)this_01,args,this_00,args_2,args_3);
  character_in_range::character_in_range
            ((character_in_range *)this,(char_type)((ulong)local_150 >> 0x38),
             (char_type)((ulong)local_150 >> 0x30));
  sequence::sequence<toml::detail::either,toml::detail::character_in_range>
            (this_00,(either *)args_2,(character_in_range *)args_3);
  character_in_range::~character_in_range((character_in_range *)0x7183e1);
  either::~either(this);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x718405);
  character_in_range::~character_in_range((character_in_range *)0x71840f);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x718429);
  character::~character((character *)0x718436);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x718450);
  character_in_range::~character_in_range((character_in_range *)0x71845d);
  sequence::~sequence((sequence *)this);
  character_in_range::~character_in_range((character_in_range *)0x718477);
  character::~character((character *)0x718484);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence utf8_3bytes(const spec&)
{
    return sequence(/*1~2 bytes = */either(
        sequence(character         (0xE0),       character_in_range(0xA0, 0xBF)),
        sequence(character_in_range(0xE1, 0xEC), character_in_range(0x80, 0xBF)),
        sequence(character         (0xED),       character_in_range(0x80, 0x9F)),
        sequence(character_in_range(0xEE, 0xEF), character_in_range(0x80, 0xBF))
    ), /*3rd byte = */ character_in_range(0x80, 0xBF));
}